

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O1

Vec_Ptr_t * Bac_PtrTransformTest(Vec_Ptr_t *vDes)

{
  uint uVar1;
  uint uVar2;
  Abc_Frame_t *pAVar3;
  Mio_Library_t *pLib;
  Vec_Ptr_t *vGatesNames;
  Vec_Ptr_t *vDes_00;
  void **ppvVar4;
  size_t sVar5;
  char *__dest;
  Vec_Ptr_t *pVVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  
  Bac_PtrDumpBlif("test1.blif",vDes);
  pAVar3 = Abc_FrameGetGlobalFrame();
  if (pAVar3 == (Abc_Frame_t *)0x0) {
    pcVar7 = "ABC framework is not started.";
  }
  else {
    pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if (pLib != (Mio_Library_t *)0x0) {
      vGatesNames = Bac_ManCollectGateNamesByTruth(pLib);
      iVar9 = vDes->nSize;
      if ((long)iVar9 < 0) {
        __assert_fail("nCap >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
      }
      vDes_00 = (Vec_Ptr_t *)malloc(0x10);
      vDes_00->nSize = 0;
      vDes_00->nCap = iVar9;
      if (iVar9 == 0) {
        ppvVar4 = (void **)0x0;
      }
      else {
        ppvVar4 = (void **)malloc((long)iVar9 << 3);
      }
      vDes_00->pArray = ppvVar4;
      if (iVar9 == 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pcVar7 = (char *)*vDes->pArray;
      if (pcVar7 == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar5 = strlen(pcVar7);
        __dest = (char *)malloc(sVar5 + 1);
        strcpy(__dest,pcVar7);
      }
      vDes_00->nSize = 1;
      *vDes_00->pArray = __dest;
      if (1 < vDes->nSize) {
        lVar8 = 1;
        do {
          pVVar6 = Bac_PtrTransformNtk((Vec_Ptr_t *)vDes->pArray[lVar8],vGatesNames);
          uVar1 = vDes_00->nSize;
          uVar2 = vDes_00->nCap;
          if (uVar1 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (vDes_00->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(vDes_00->pArray,0x80);
              }
              iVar9 = 0x10;
            }
            else {
              iVar9 = uVar2 * 2;
              if (iVar9 <= (int)uVar2) goto LAB_0032b7d3;
              if (vDes_00->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(vDes_00->pArray,(ulong)uVar2 << 4);
              }
            }
            vDes_00->pArray = ppvVar4;
            vDes_00->nCap = iVar9;
          }
LAB_0032b7d3:
          vDes_00->nSize = uVar1 + 1;
          vDes_00->pArray[(int)uVar1] = pVVar6;
          lVar8 = lVar8 + 1;
        } while (lVar8 < vDes->nSize);
      }
      Bac_PtrDumpBlif("test2.blif",vDes_00);
      if (vGatesNames->pArray != (void **)0x0) {
        free(vGatesNames->pArray);
        vGatesNames->pArray = (void **)0x0;
      }
      if (vGatesNames == (Vec_Ptr_t *)0x0) {
        return vDes_00;
      }
      free(vGatesNames);
      return vDes_00;
    }
    pcVar7 = "Standard cell library is not entered.";
  }
  puts(pcVar7);
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformTest( Vec_Ptr_t * vDes )
{
    Mio_Library_t * pLib;
    Vec_Ptr_t * vGatesNames;
    Vec_Ptr_t * vNtk, * vNew; int i;
    // dump BLIF before transformation
    Bac_PtrDumpBlif( "test1.blif", vDes );
    if ( Abc_FrameGetGlobalFrame() == NULL )
    {
        printf( "ABC framework is not started.\n" );
        return NULL;
    }
    pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pLib == NULL )
    {
        printf( "Standard cell library is not entered.\n" );
        return NULL;
    }
    vGatesNames = Bac_ManCollectGateNamesByTruth( pLib );
    // transform
    vNew = Vec_PtrAllocExact( Vec_PtrSize(vDes) );
    Vec_PtrPush( vNew, Abc_UtilStrsav((char *)Vec_PtrEntry(vDes, 0)) );
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vDes, vNtk, i, 1 )
        Vec_PtrPush( vNew, Bac_PtrTransformNtk(vNtk, vGatesNames) );
    // dump BLIF after transformation
    Bac_PtrDumpBlif( "test2.blif", vNew );
    Vec_PtrFree( vGatesNames );
    return vNew;
}